

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

wchar_t pm_list_w(wchar_t *start,wchar_t *end,wchar_t c,wchar_t flags)

{
  wchar_t *pwVar1;
  wchar_t rangeEnd;
  wchar_t nomatch;
  wchar_t match;
  wchar_t nextRangeStart;
  wchar_t rangeStart;
  wchar_t *p;
  wchar_t flags_local;
  wchar_t c_local;
  wchar_t *end_local;
  wchar_t *start_local;
  
  rangeStart = L'\0';
  match = L'\x01';
  nomatch = L'\0';
  p = start;
  if (((*start == L'!') || (*start == L'^')) && (start < end)) {
    match = L'\0';
    nomatch = L'\x01';
    p = start + 1;
  }
  do {
    if (end <= p) {
      return nomatch;
    }
    nextRangeStart = L'\0';
    if (*p == L'-') {
      if ((rangeStart == L'\0') || (p == end + -1)) {
        if (*p == c) {
          return match;
        }
      }
      else {
        rangeEnd = p[1];
        pwVar1 = p + 1;
        if (rangeEnd == L'\\') {
          rangeEnd = p[2];
          pwVar1 = p + 2;
        }
        p = pwVar1;
        if ((rangeStart <= c) && (c <= rangeEnd)) {
          return match;
        }
      }
    }
    else {
      if (*p == L'\\') {
        p = p + 1;
      }
      if (*p == c) {
        return match;
      }
      nextRangeStart = *p;
    }
    rangeStart = nextRangeStart;
    p = p + 1;
  } while( true );
}

Assistant:

static int
pm_list_w(const wchar_t *start, const wchar_t *end, const wchar_t c, int flags)
{
	const wchar_t *p = start;
	wchar_t rangeStart = L'\0', nextRangeStart;
	int match = 1, nomatch = 0;

	/* This will be used soon... */
	(void)flags; /* UNUSED */

	/* If this is a negated class, return success for nomatch. */
	if ((*p == L'!' || *p == L'^') && p < end) {
		match = 0;
		nomatch = 1;
		++p;
	}

	while (p < end) {
		nextRangeStart = L'\0';
		switch (*p) {
		case L'-':
			/* Trailing or initial '-' is not special. */
			if ((rangeStart == L'\0') || (p == end - 1)) {
				if (*p == c)
					return (match);
			} else {
				wchar_t rangeEnd = *++p;
				if (rangeEnd == L'\\')
					rangeEnd = *++p;
				if ((rangeStart <= c) && (c <= rangeEnd))
					return (match);
			}
			break;
		case L'\\':
			++p;
			/* Fall through */
		default:
			if (*p == c)
				return (match);
			nextRangeStart = *p; /* Possible start of range. */
		}
		rangeStart = nextRangeStart;
		++p;
	}
	return (nomatch);
}